

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ISMSnoop::ISMSnoop(ISMSnoop *this,ISMSnoopLib *lib)

{
  bool bVar1;
  element_type *peVar2;
  ExpressionLhs<const_std::function<ISMSnoopInstrument_*(const_char_*)>_&> EVar3;
  ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*)>_&> EVar4;
  ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)>_&> EVar5;
  ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*)>_&> EVar6;
  ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>_&> EVar7;
  ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>_&> local_f28;
  SourceLineInfo local_f18;
  undefined1 local_ef0 [8];
  ResultBuilder __catchResult_4;
  SourceLineInfo local_c40;
  undefined1 local_c18 [8];
  ResultBuilder __catchResult_3;
  SourceLineInfo local_968;
  undefined1 local_940 [8];
  ResultBuilder __catchResult_2;
  SourceLineInfo local_690;
  undefined1 local_668 [8];
  ResultBuilder __catchResult_1;
  SourceLineInfo local_3b8;
  undefined1 local_390 [8];
  ResultBuilder __catchResult;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  __shared_ptr_access<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  ISMSnoopLib *lib_local;
  ISMSnoop *this_local;
  
  local_18 = (__shared_ptr_access<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             lib;
  lib_local = (ISMSnoopLib *)this;
  peVar2 = std::__shared_ptr_access<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)lib);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"ismsnoop_open",&local_39);
  rtw::DynamicLibrary::get_function<ISMSnoopInstrument*(char_const*)>
            (&this->open,peVar2,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  peVar2 = std::__shared_ptr_access<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"ismsnoop_close",&local_71);
  rtw::DynamicLibrary::get_function<void(ISMSnoopInstrument*)>
            (&this->close,peVar2,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  peVar2 = std::__shared_ptr_access<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"ismsnoop_get_panel_icon_size",&local_99);
  rtw::DynamicLibrary::get_function<void(ISMSnoopInstrument*,int*,int*,int*)>
            (&this->get_panel_icon_size,peVar2,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  peVar2 = std::__shared_ptr_access<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"ismsnoop_get_panel_icon_bytes",&local_c1);
  rtw::DynamicLibrary::get_function<void(ISMSnoopInstrument*,char*)>
            (&this->get_panel_icon_bytes,peVar2,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  peVar2 = std::__shared_ptr_access<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"ismsnoop_get_name",(allocator *)&__catchResult.field_0x29f)
  ;
  rtw::DynamicLibrary::get_function<void(ISMSnoopInstrument*,char*,int*)>
            (&this->get_name,peVar2,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&__catchResult.field_0x29f);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
               ,0x2e);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_390,"REQUIRE",&local_3b8,"open",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_3b8);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_390,&this->open);
    __catchResult_1._664_8_ = EVar3.m_rb;
    Catch::ExpressionLhs<const_std::function<ISMSnoopInstrument_*(const_char_*)>_&>::endExpression
              ((ExpressionLhs<const_std::function<ISMSnoopInstrument_*(const_char_*)>_&> *)
               &__catchResult_1.m_shouldDebugBreak);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_390);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_390);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_390);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_690,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
               ,0x2f);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_668,"REQUIRE",&local_690,"close",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_690);
    EVar4 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_668,&this->close);
    __catchResult_2._664_8_ = EVar4.m_rb;
    Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*)>_&>::endExpression
              ((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*)>_&> *)
               &__catchResult_2.m_shouldDebugBreak);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_668);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_668);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_668);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_968,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
               ,0x30);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_940,"REQUIRE",&local_968,"get_panel_icon_size",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_968);
    EVar5 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_940,&this->get_panel_icon_size);
    __catchResult_3._664_8_ = EVar5.m_rb;
    Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)>_&>::
    endExpression((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)>_&>
                   *)&__catchResult_3.m_shouldDebugBreak);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_940);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_940);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_940);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_c40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
               ,0x31);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_c18,"REQUIRE",&local_c40,"get_panel_icon_bytes",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_c40);
    EVar6 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_c18,&this->get_panel_icon_bytes)
    ;
    __catchResult_4._664_8_ = EVar6.m_rb;
    Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*)>_&>::endExpression
              ((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*)>_&> *)
               &__catchResult_4.m_shouldDebugBreak);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_c18);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_c18);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_c18);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_f18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
               ,0x32);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_ef0,"REQUIRE",&local_f18,"get_name",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_f18);
    EVar7 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_ef0,&this->get_name);
    local_f28 = EVar7;
    Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>_&>::
    endExpression(&local_f28);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_ef0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_ef0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_ef0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

ISMSnoop::ISMSnoop(const ISMSnoopLib & lib)
	: open(lib.lib->get_function<Sig_ismsnoop_open>("ismsnoop_open"))
	, close(lib.lib->get_function<Sig_ismsnoop_close>("ismsnoop_close"))
	, get_panel_icon_size(lib.lib->get_function<Sig_ismsnoop_get_panel_icon_size>("ismsnoop_get_panel_icon_size"))
	, get_panel_icon_bytes(lib.lib->get_function<Sig_ismsnoop_get_panel_icon_bytes>("ismsnoop_get_panel_icon_bytes"))
	, get_name(lib.lib->get_function<Sig_ismsnoop_get_name>("ismsnoop_get_name"))
{
	REQUIRE(open);
	REQUIRE(close);
	REQUIRE(get_panel_icon_size);
	REQUIRE(get_panel_icon_bytes);
	REQUIRE(get_name);
}